

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O2

type jsoncons::jsonpointer::
     remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::__cxx11::string>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *location_str,
               error_code *ec)

{
  basic_json_pointer<char> jsonptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_38;
  string_view_type local_20;
  
  local_20._M_str = (location_str->_M_dataplus)._M_p;
  local_20._M_len = location_str->_M_string_length;
  basic_json_pointer<char>::parse((basic_json_pointer<char> *)&vStack_38,&local_20,ec);
  if (ec->_M_value == 0) {
    remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              (root,(basic_json_pointer<char> *)&vStack_38,ec);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_38);
  return;
}

Assistant:

typename std::enable_if<std::is_convertible<StringSource,jsoncons::basic_string_view<typename Json::char_type>>::value,void>::type
    remove(Json& root, const StringSource& location_str, std::error_code& ec)
    {
        auto jsonptr = basic_json_pointer<typename Json::char_type>::parse(location_str, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        remove(root, jsonptr, ec);
    }